

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementHexaANCF_3843.cpp
# Opt level: O1

void __thiscall
chrono::fea::ChElementHexaANCF_3843::EvaluateElementVel
          (ChElementHexaANCF_3843 *this,double xi,double eta,double zeta,ChVector<double> *Result)

{
  VectorN Sxi_compact;
  Matrix3xN e_bardot;
  Matrix3xN *local_490;
  VectorN *local_488;
  VectorN local_480;
  Matrix3xN local_380;
  
  Calc_Sxi_compact(this,&local_480,xi,eta,zeta);
  CalcCoordDerivMatrix(this,&local_380);
  local_490 = &local_380;
  local_488 = &local_480;
  ChVector<double>::operator=
            (Result,(MatrixBase<Eigen::Product<Eigen::Matrix<double,_3,_32,_1,_3,_32>,_Eigen::Matrix<double,_32,_1,_0,_32,_1>,_0>_>
                     *)&local_490);
  return;
}

Assistant:

void ChElementHexaANCF_3843::EvaluateElementVel(double xi, double eta, const double zeta, ChVector<>& Result) {
    VectorN Sxi_compact;
    Calc_Sxi_compact(Sxi_compact, xi, eta, zeta);

    Matrix3xN e_bardot;
    CalcCoordDerivMatrix(e_bardot);

    // rdot = S*edot written in compact form
    Result = e_bardot * Sxi_compact;
}